

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::BackUp(CopyingOutputStreamAdaptor *this,int count)

{
  Nullable<const_char_*> pcVar1;
  LogMessage local_20;
  
  if (count == 0) {
    WriteBuffer(this);
    return;
  }
  pcVar1 = absl::lts_20250127::log_internal::Check_GEImpl(count,0,"count >= 0");
  if (pcVar1 == (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::log_internal::Check_EQImpl
                       (this->buffer_used_,this->buffer_size_,"buffer_used_ == buffer_size_");
    if (pcVar1 == (Nullable<const_char_*>)0x0) {
      pcVar1 = absl::lts_20250127::log_internal::Check_LEImpl
                         (count,this->buffer_used_,"count <= buffer_used_");
      if (pcVar1 == (Nullable<const_char_*>)0x0) {
        this->buffer_used_ = this->buffer_used_ - count;
        return;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x148,pcVar1);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&local_20,
                 (char (*) [78])
                 " Can\'t back up over more bytes than were returned by the last call to Next().");
    }
    else {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x146,pcVar1);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&local_20,(char (*) [43])" BackUp() can only be called after Next().");
    }
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_20);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
             ,0x145,pcVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

void CopyingOutputStreamAdaptor::BackUp(int count) {
  if (count == 0) {
    Flush();
    return;
  }
  ABSL_CHECK_GE(count, 0);
  ABSL_CHECK_EQ(buffer_used_, buffer_size_)
      << " BackUp() can only be called after Next().";
  ABSL_CHECK_LE(count, buffer_used_)
      << " Can't back up over more bytes than were returned by the last call"
         " to Next().";

  buffer_used_ -= count;
}